

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O1

void __thiscall counted_functor::~counted_functor(counted_functor *this)

{
  unique_lock<std::mutex> g;
  unique_lock<std::mutex> local_10;
  
  local_10._M_device = &lock;
  local_10._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_10);
  local_10._M_owns = true;
  objects = objects + -1;
  std::unique_lock<std::mutex>::~unique_lock(&local_10);
  return;
}

Assistant:

~counted_functor() { add(-1); }